

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_stream.hpp
# Opt level: O0

void __thiscall
Catch::StreamBufImpl<Catch::OutputDebugWriter,_256UL>::sync
          (StreamBufImpl<Catch::OutputDebugWriter,_256UL> *this)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  allocator local_31;
  string local_30 [32];
  StreamBufImpl<Catch::OutputDebugWriter,_256UL> *local_10;
  StreamBufImpl<Catch::OutputDebugWriter,_256UL> *this_local;
  
  local_10 = this;
  lVar1 = std::streambuf::pbase();
  lVar2 = std::streambuf::pptr();
  if (lVar1 != lVar2) {
    pcVar3 = (char *)std::streambuf::pbase();
    lVar1 = std::streambuf::pptr();
    lVar2 = std::streambuf::pbase();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,pcVar3,lVar1 - lVar2,&local_31);
    OutputDebugWriter::operator()((OutputDebugWriter *)&this->field_0x140,(string *)local_30);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    pcVar3 = (char *)std::streambuf::pbase();
    std::streambuf::epptr();
    std::streambuf::setp((char *)this,pcVar3);
  }
  return;
}

Assistant:

int sync() {
            if( pbase() != pptr() ) {
                m_writer( std::string( pbase(), static_cast<std::string::size_type>( pptr() - pbase() ) ) );
                setp( pbase(), epptr() );
            }
            return 0;
        }